

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml.c
# Opt level: O0

void dump_FMfield_as_XML(FMContext c,FMFormat_conflict format,int field,void *data,void *string_base
                        ,int encode,int verbose)

{
  ffs_dstring __ptr;
  ffs_dstring ds;
  ffs_dstring in_stack_00000100;
  int in_stack_0000010c;
  void *in_stack_00000110;
  void *in_stack_00000118;
  int in_stack_00000124;
  FMFormat_conflict in_stack_00000128;
  
  __ptr = new_dstring();
  generic_field_to_XML
            (in_stack_00000128,in_stack_00000124,in_stack_00000118,in_stack_00000110,
             in_stack_0000010c,in_stack_00000100);
  printf("%s",__ptr->string);
  free(__ptr->string);
  free(__ptr);
  return;
}

Assistant:

extern void
dump_FMfield_as_XML(FMContext c, FMFormat format, int field, void *data,
		    void *string_base, int encode, int verbose)
{
    ffs_dstring ds = new_dstring();
    generic_field_to_XML(format, field, data, string_base, encode,
			 ds);
    printf("%s", ds->string);
    free(ds->string);
    free(ds);
}